

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::visitBlock(wasm::Block__
          (void *this,Block *curr)

{
  Expression *pEVar1;
  PassOptions *pPVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  Expression **ppEVar6;
  Module *pMVar7;
  Unary *pUVar8;
  Expression *pEVar9;
  Binary *pBVar10;
  Drop *pDVar11;
  bool local_26a;
  bool local_269;
  Builder local_210;
  Builder builder_1;
  Builder builder;
  EffectAnalyzer local_1f0;
  BasicType local_7c;
  Break *local_78;
  Break *br2;
  Break *local_68;
  Break *br1;
  Index i_1;
  Builder local_50;
  Break *local_48;
  Break *ifFalseBreak;
  Break *local_38;
  Break *ifTrueBreak;
  If *iff;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAStack_20;
  Index i;
  ExpressionList *list;
  Block *curr_local;
  FinalOptimizer *this_local;
  
  pAStack_20 = &(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  iff._4_4_ = 0;
  list = (ExpressionList *)curr;
  curr_local = (Block *)this;
  do {
    uVar4 = (ulong)iff._4_4_;
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(pAStack_20);
    if (sVar5 <= uVar4) {
      sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(pAStack_20)
      ;
      if (1 < sVar5) {
        for (br1._4_4_ = 0; uVar4 = (ulong)br1._4_4_,
            sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                              (pAStack_20), uVar4 < sVar5 - 1; br1._4_4_ = br1._4_4_ + 1) {
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (pAStack_20,(ulong)br1._4_4_);
          local_68 = Expression::dynCast<wasm::Break>(*ppEVar6);
          local_269 = true;
          if ((local_68 != (Break *)0x0) &&
             (local_269 = true, local_68->condition != (Expression *)0x0)) {
            br2._4_4_ = 1;
            local_269 = wasm::Type::operator==
                                  (&(local_68->super_SpecificExpression<(wasm::Expression::Id)4>).
                                    super_Expression.type,(BasicType *)((long)&br2 + 4));
          }
          if (local_269 == false) {
            if (local_68->value != (Expression *)0x0) {
              __assert_fail("!br1->value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                            ,0x3c3,
                            "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                           );
            }
            ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](pAStack_20,(ulong)(br1._4_4_ + 1));
            local_78 = Expression::dynCast<wasm::Break>(*ppEVar6);
            if ((local_78 != (Break *)0x0) &&
               (bVar3 = IString::operator!=(&(local_68->name).super_IString,
                                            &(local_78->name).super_IString), !bVar3)) {
              if (local_78->value != (Expression *)0x0) {
                __assert_fail("!br2->value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                              ,0x3c8,
                              "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                             );
              }
              if (local_78->condition == (Expression *)0x0) {
                pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                                   ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)
                                    this);
                Builder::Builder(&local_210,pMVar7);
                pDVar11 = Builder::makeDrop(&local_210,local_68->condition);
                ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](pAStack_20,(ulong)br1._4_4_);
                *ppEVar6 = (Expression *)pDVar11;
              }
              else {
                local_26a = false;
                if ((*(byte *)((long)this + 0xd8) & 1) != 0) {
                  local_7c = unreachable;
                  local_26a = wasm::Type::operator!=
                                        (&(local_78->
                                          super_SpecificExpression<(wasm::Expression::Id)4>).
                                          super_Expression.type,&local_7c);
                }
                if (local_26a != false) {
                  pPVar2 = *(PassOptions **)((long)this + 0xe0);
                  pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                                     ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                       *)this);
                  EffectAnalyzer::EffectAnalyzer(&local_1f0,pPVar2,pMVar7,local_78->condition);
                  bVar3 = EffectAnalyzer::hasSideEffects(&local_1f0);
                  EffectAnalyzer::~EffectAnalyzer(&local_1f0);
                  if (((bVar3 ^ 0xffU) & 1) != 0) {
                    pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                                       ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                         *)this);
                    Builder::Builder(&builder_1,pMVar7);
                    pBVar10 = Builder::makeBinary(&builder_1,OrInt32,local_68->condition,
                                                  local_78->condition);
                    local_68->condition = (Expression *)pBVar10;
                    ExpressionManipulator::nop<wasm::Break>(local_78);
                  }
                }
              }
            }
          }
        }
        tablify(wasm::Block__(this,(Block *)list);
        restructureIf(wasm::Block__(this,(Block *)list);
      }
      return;
    }
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (pAStack_20,(ulong)iff._4_4_);
    ifTrueBreak = (Break *)Expression::dynCast<wasm::If>(*ppEVar6);
    if ((ifTrueBreak != (Break *)0x0) && (ifTrueBreak->value != (Expression *)0x0)) {
      local_38 = Expression::dynCast<wasm::Break>
                           ((Expression *)(ifTrueBreak->name).super_IString.str._M_str);
      if ((local_38 != (Break *)0x0) && (local_38->condition == (Expression *)0x0)) {
        pEVar9 = (Expression *)(ifTrueBreak->name).super_IString.str._M_len;
        pEVar1 = local_38->value;
        pPVar2 = *(PassOptions **)((long)this + 0xe0);
        pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                           ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
        bVar3 = canTurnIfIntoBrIf(pEVar9,pEVar1,pPVar2,pMVar7);
        if (bVar3) {
          local_38->condition = (Expression *)(ifTrueBreak->name).super_IString.str._M_len;
          Break::finalize(local_38);
          pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                             ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
          Builder::Builder((Builder *)&ifFalseBreak,pMVar7);
          pEVar9 = Builder::dropIfConcretelyTyped((Builder *)&ifFalseBreak,(Expression *)local_38);
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (pAStack_20,(ulong)iff._4_4_);
          *ppEVar6 = pEVar9;
          ExpressionManipulator::spliceIntoBlock((Block *)list,iff._4_4_ + 1,ifTrueBreak->value);
          goto LAB_01a1f291;
        }
      }
      local_48 = Expression::dynCast<wasm::Break>(ifTrueBreak->value);
      if ((local_48 != (Break *)0x0) && (local_48->condition == (Expression *)0x0)) {
        pEVar9 = (Expression *)(ifTrueBreak->name).super_IString.str._M_len;
        pEVar1 = local_48->value;
        pPVar2 = *(PassOptions **)((long)this + 0xe0);
        pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                           ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
        bVar3 = canTurnIfIntoBrIf(pEVar9,pEVar1,pPVar2,pMVar7);
        if (bVar3) {
          pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                             ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
          Builder::Builder(&local_50,pMVar7);
          pUVar8 = Builder::makeUnary(&local_50,EqZInt32,
                                      (Expression *)(ifTrueBreak->name).super_IString.str._M_len);
          local_48->condition = (Expression *)pUVar8;
          Break::finalize(local_48);
          pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                             ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
          Builder::Builder((Builder *)&stack0xffffffffffffffa8,pMVar7);
          pEVar9 = Builder::dropIfConcretelyTyped
                             ((Builder *)&stack0xffffffffffffffa8,(Expression *)local_48);
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (pAStack_20,(ulong)iff._4_4_);
          *ppEVar6 = pEVar9;
          ExpressionManipulator::spliceIntoBlock
                    ((Block *)list,iff._4_4_ + 1,
                     (Expression *)(ifTrueBreak->name).super_IString.str._M_str);
        }
      }
    }
LAB_01a1f291:
    iff._4_4_ = iff._4_4_ + 1;
  } while( true );
}

Assistant:

void visitBlock(Block* curr) {
        // if a block has an if br else br, we can un-conditionalize the latter,
        // allowing the if to become a br_if.
        // * note that if not in a block already, then we need to create a block
        //   for this, so not useful otherwise
        // * note that this only happens at the end of a block, as code after
        //   the if is dead
        // * note that we do this at the end, because un-conditionalizing can
        //   interfere with optimizeLoop()ing.
        auto& list = curr->list;
        for (Index i = 0; i < list.size(); i++) {
          auto* iff = list[i]->dynCast<If>();
          if (!iff || !iff->ifFalse) {
            // if it lacked an if-false, it would already be a br_if, as that's
            // the easy case
            continue;
          }
          auto* ifTrueBreak = iff->ifTrue->dynCast<Break>();
          if (ifTrueBreak && !ifTrueBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifTrueBreak->value,
                                passOptions,
                                *getModule())) {
            // we are an if-else where the ifTrue is a break without a
            // condition, so we can do this
            ifTrueBreak->condition = iff->condition;
            ifTrueBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifTrueBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifFalse);
            continue;
          }
          // otherwise, perhaps we can flip the if
          auto* ifFalseBreak = iff->ifFalse->dynCast<Break>();
          if (ifFalseBreak && !ifFalseBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifFalseBreak->value,
                                passOptions,
                                *getModule())) {
            ifFalseBreak->condition =
              Builder(*getModule()).makeUnary(EqZInt32, iff->condition);
            ifFalseBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifFalseBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifTrue);
            continue;
          }
        }
        if (list.size() >= 2) {
          // combine/optimize adjacent br_ifs + a br (maybe _if) right after it
          for (Index i = 0; i < list.size() - 1; i++) {
            auto* br1 = list[i]->dynCast<Break>();
            // avoid unreachable brs, as they are dead code anyhow, and after
            // merging them the outer scope could need type changes
            if (!br1 || !br1->condition || br1->type == Type::unreachable) {
              continue;
            }
            assert(!br1->value);
            auto* br2 = list[i + 1]->dynCast<Break>();
            if (!br2 || br1->name != br2->name) {
              continue;
            }
            assert(!br2->value); // same target as previous, which has no value
            // a br_if and then a br[_if] with the same target right after it
            if (br2->condition) {
              if (shrink && br2->type != Type::unreachable) {
                // Join adjacent br_ifs to the same target, making one br_if
                // with a "selectified" condition that executes both.
                if (!EffectAnalyzer(passOptions, *getModule(), br2->condition)
                       .hasSideEffects()) {
                  // it's ok to execute them both, do it
                  Builder builder(*getModule());
                  br1->condition =
                    builder.makeBinary(OrInt32, br1->condition, br2->condition);
                  ExpressionManipulator::nop(br2);
                }
              }
            } else {
              // merge, we go there anyhow
              Builder builder(*getModule());
              list[i] = builder.makeDrop(br1->condition);
            }
          }
          // Combine adjacent br_ifs that test the same value into a br_table,
          // when that makes sense.
          tablify(curr);
          // Pattern-patch ifs, recreating them when it makes sense.
          restructureIf(curr);
        }
      }